

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LazyMessageExtension *pLVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  LogMessage local_70;
  int local_38;
  LogFinisher local_31;
  int value_local;
  
  local_38 = value;
  pVar5 = Insert(this,number);
  pEVar2 = pVar5.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated == false) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x1f6);
      pLVar3 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
    CVar1 = anon_unknown_22::cpp_type(pEVar2->type);
    if (CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x1f6);
      pLVar3 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
    if (pEVar2->is_packed != packed) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x1f7);
      pLVar3 = LogMessage::operator<<
                         (&local_70,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
  }
  else {
    pEVar2->type = type;
    CVar1 = anon_unknown_22::cpp_type(type);
    if (CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x1f0);
      pLVar3 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
    pEVar2->is_repeated = true;
    pEVar2->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pLVar4 = (LazyMessageExtension *)operator_new(0x10);
      pLVar4->_vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar4[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      pLVar4 = (LazyMessageExtension *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x10,
                          arena_destruct_object<google::protobuf::RepeatedField<int>>);
      pLVar4->_vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar4[1]._vptr_LazyMessageExtension = (_func_int **)this_00;
    }
    (pEVar2->field_0).lazymessage_value = pLVar4;
  }
  RepeatedField<int>::Add((pEVar2->field_0).repeated_int32_value,&local_38);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}